

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

EVaction INT_EVassoc_mutated_imm_action
                   (CManager_conflict cm,EVstone stone_id,EVaction act_num,
                   EVImmediateHandlerFunc func,void *client_data,FMFormat reference_format,
                   int_free_func free_func)

{
  int iVar1;
  action_class aVar2;
  stone_type p_Var3;
  response_cache_element *prVar4;
  int iVar5;
  
  p_Var3 = stone_struct(cm->evp,stone_id);
  if (p_Var3 == (stone_type)0x0) {
    iVar5 = -1;
  }
  else {
    iVar5 = p_Var3->response_cache_count;
    prVar4 = (response_cache_element *)
             INT_CMrealloc(p_Var3->response_cache,(long)iVar5 * 0x30 + 0x30);
    p_Var3->response_cache = prVar4;
    iVar1 = p_Var3->response_cache_count;
    prVar4[iVar1].action_type = Action_Immediate;
    prVar4[iVar1].requires_decoded = 1;
    prVar4[iVar1].proto_action_id = act_num;
    prVar4[iVar1].o.imm.handler = func;
    prVar4[iVar1].o.imm.client_data = client_data;
    prVar4[iVar1].o.imm.free_func = free_func;
    prVar4[iVar1].reference_format = reference_format;
    aVar2 = cached_stage_for_action
                      ((proto_action *)(ulong)p_Var3->proto_actions[act_num].action_type);
    prVar4[iVar1].stage = aVar2;
    p_Var3->response_cache_count = p_Var3->response_cache_count + 1;
  }
  return iVar5;
}

Assistant:

extern EVaction
INT_EVassoc_mutated_imm_action(CManager cm, EVstone stone_id, EVaction act_num,
			       EVImmediateHandlerFunc func, void *client_data, 
			       FMFormat reference_format, int_free_func free_func)
{
    event_path_data evp = cm->evp;
    stone_type stone;
    int resp_num;

    stone = stone_struct(evp, stone_id);
    if (!stone) return -1;

    resp_num = stone->response_cache_count;
    stone->response_cache = realloc(stone->response_cache, sizeof(stone->response_cache[0]) * (resp_num + 1));
    response_cache_element *resp = &stone->response_cache[stone->response_cache_count];
    resp->action_type = Action_Immediate;
    resp->requires_decoded = 1;
    resp->proto_action_id = act_num;
    resp->o.imm.handler = func;
    resp->o.imm.client_data = client_data;
    resp->o.imm.free_func = free_func;
    resp->reference_format = reference_format;
    resp->stage = cached_stage_for_action(&stone->proto_actions[act_num]);
    stone->response_cache_count++;
    return resp_num;
}